

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

bool __thiscall
vkt::texture::SampleVerifier::verifySampleMipmapLevel
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,Vec4 *coord,Vec2 *lodBounds,
          int level,ostream *report)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  Vector<int,_3> local_118;
  IVec3 IStack_10c;
  ulong local_f8;
  SampleArguments *local_f0;
  Vec4 *local_e8;
  Vec2 *local_e0;
  IVec3 local_d8;
  IVec3 IStack_cc;
  Vec4 *local_c0;
  Vec3 local_b8;
  Vec3 VStack_ac;
  IVec3 gridCoord [2];
  Vec3 local_78;
  Vec3 VStack_6c;
  FloatFormat coordFormat;
  
  local_f8 = 0;
  if (this->m_imParams->levels + -1 != level) {
    local_f8 = (ulong)this->m_samplerParams->mipmapFilter;
  }
  VStack_6c.m_data[1] = 0.0;
  VStack_6c.m_data[2] = 0.0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  VStack_6c.m_data[0] = 0.0;
  VStack_ac.m_data[1] = 0.0;
  VStack_ac.m_data[2] = 0.0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  VStack_ac.m_data[0] = 0.0;
  IStack_10c.m_data[1] = 0;
  IStack_10c.m_data[2] = 0;
  local_118.m_data[0] = 0;
  local_118.m_data[1] = 0;
  local_118.m_data[2] = 0;
  IStack_10c.m_data[0] = 0;
  IStack_cc.m_data[1] = 0;
  IStack_cc.m_data[2] = 0;
  local_d8.m_data[0] = 0;
  local_d8.m_data[1] = 0;
  local_d8.m_data[2] = 0;
  IStack_cc.m_data[0] = 0;
  local_f0 = args;
  local_e8 = result;
  local_e0 = lodBounds;
  tcu::FloatFormat::FloatFormat(&coordFormat,-0x20,0x20,0x10,true,MAYBE,MAYBE,MAYBE);
  util::calcUnnormalizedCoordRange
            (coord,&(this->m_levels->
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    )._M_impl.super__Vector_impl_data._M_start[level].m_size,&coordFormat,&local_78,
             &local_b8);
  util::calcTexelGridCoordRange(&local_78,&local_b8,this->m_coordBits,&local_118,&local_d8);
  local_c0 = coord;
  std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
  poVar2 = (ostream *)std::ostream::operator<<(report,level);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," computed unnormalized coordinate range: [",0x2a);
  poVar2 = tcu::operator<<(poVar2,&local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = tcu::operator<<(poVar2,&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
  uVar6 = local_f8;
  poVar2 = (ostream *)std::ostream::operator<<(report,level);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," computed texel grid coordinate range: [",0x28);
  poVar2 = tcu::operator<<(poVar2,&local_118);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = tcu::operator<<(poVar2,&local_d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  if ((int)uVar6 == 1) {
    iVar3 = level + 1;
    util::calcUnnormalizedCoordRange
              (local_c0,&(this->m_levels->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start[iVar3].m_size,&coordFormat,
               &VStack_6c,&VStack_ac);
    util::calcTexelGridCoordRange(&VStack_6c,&VStack_ac,this->m_coordBits,&IStack_10c,&IStack_cc);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
    poVar2 = (ostream *)std::ostream::operator<<(report,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," computed unnormalized coordinate range: [",0x2a);
    poVar2 = tcu::operator<<(poVar2,&VStack_6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    poVar2 = tcu::operator<<(poVar2,&VStack_ac);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
    poVar2 = (ostream *)std::ostream::operator<<(report,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," computed texel grid coordinate range: [",0x28);
    poVar2 = tcu::operator<<(poVar2,&IStack_10c);
    uVar6 = local_f8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    poVar2 = tcu::operator<<(poVar2,&IStack_cc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  }
  else {
    VStack_ac.m_data[2] = 0.0;
    VStack_ac.m_data[0] = 0.0;
    VStack_ac.m_data[1] = 0.0;
    VStack_6c.m_data[2] = 0.0;
    VStack_6c.m_data[0] = 0.0;
    VStack_6c.m_data[1] = 0.0;
    IStack_cc.m_data[2] = 0;
    IStack_cc.m_data[0] = 0;
    IStack_cc.m_data[1] = 0;
    IStack_10c.m_data[2] = 0;
    IStack_10c.m_data[0] = 0;
    IStack_10c.m_data[1] = 0;
  }
  gridCoord[0].m_data[2] = local_118.m_data[2];
  gridCoord[0].m_data[0] = local_118.m_data[0];
  gridCoord[0].m_data[1] = local_118.m_data[1];
  gridCoord[1].m_data[1] = IStack_10c.m_data[1];
  gridCoord[1].m_data[0] = IStack_10c.m_data[0];
  gridCoord[1].m_data[2] = IStack_10c.m_data[2];
  bVar1 = verifySampleTexelGridCoords
                    (this,local_f0,local_e8,gridCoord,gridCoord + 1,local_e0,level,
                     (VkSamplerMipmapMode)uVar6,report);
  bVar7 = true;
  if (!bVar1) {
    lVar4 = 0;
    bVar1 = true;
    do {
      do {
        bVar7 = bVar1;
        lVar5 = 0;
        do {
          if (bVar7) {
            iVar3 = gridCoord[lVar4].m_data[lVar5] + 1;
            gridCoord[lVar4].m_data[lVar5] = iVar3;
            if ((&local_d8)[lVar4].m_data[lVar5] < iVar3) {
              gridCoord[lVar4].m_data[lVar5] = (&local_118)[lVar4].m_data[lVar5];
            }
            else {
              bVar7 = false;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        bVar8 = lVar4 == 0;
        lVar4 = lVar4 + 1;
        bVar1 = bVar7;
      } while (bVar8);
      if (bVar7 != false) break;
      bVar8 = verifySampleTexelGridCoords
                        (this,local_f0,local_e8,gridCoord,gridCoord + 1,local_e0,level,
                         (VkSamplerMipmapMode)uVar6,report);
      lVar4 = 0;
      bVar1 = true;
    } while (!bVar8);
    bVar7 = (bool)(bVar7 ^ 1);
  }
  return bVar7;
}

Assistant:

bool SampleVerifier::verifySampleMipmapLevel (const SampleArguments&	args,
											  const Vec4&				result,
											  const Vec4&				coord,
											  const Vec2&				lodBounds,
											  int						level,
											  std::ostream&				report) const
{
	DE_ASSERT(level < m_imParams.levels);

	VkSamplerMipmapMode mipmapFilter = m_samplerParams.mipmapFilter;

	if (level == m_imParams.levels - 1)
	{
		mipmapFilter = VK_SAMPLER_MIPMAP_MODE_NEAREST;
	}

	Vec3	unnormalizedCoordMin[2];
	Vec3	unnormalizedCoordMax[2];
	IVec3	gridCoordMin[2];
	IVec3	gridCoordMax[2];

	const FloatFormat coordFormat(-32, 32, 16, true);

	calcUnnormalizedCoordRange(coord,
							   m_levels[level].getSize(),
							   coordFormat,
							   unnormalizedCoordMin[0],
							   unnormalizedCoordMax[0]);

	calcTexelGridCoordRange(unnormalizedCoordMin[0],
							unnormalizedCoordMax[0],
							m_coordBits,
							gridCoordMin[0],
							gridCoordMax[0]);

	report << "Level " << level << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[0] << ", " << unnormalizedCoordMax[0] << "]\n";
	report << "Level " << level << " computed texel grid coordinate range: [" << gridCoordMin[0] << ", " << gridCoordMax[0] << "]\n";

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		calcUnnormalizedCoordRange(coord,
								   m_levels[level+1].getSize(),
								   coordFormat,
								   unnormalizedCoordMin[1],
								   unnormalizedCoordMax[1]);

		calcTexelGridCoordRange(unnormalizedCoordMin[1],
								unnormalizedCoordMax[1],
								m_coordBits,
								gridCoordMin[1],
								gridCoordMax[1]);


		report << "Level " << level+1 << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[1] << " - " << unnormalizedCoordMax[1] << "]\n";
		report << "Level " << level+1 << " computed texel grid coordinate range: [" << gridCoordMin[1] << " - " << gridCoordMax[1] << "]\n";
	}
	else
	{
		unnormalizedCoordMin[1] = unnormalizedCoordMax[1] = Vec3(0.0f);
		gridCoordMin[1] = gridCoordMax[1] = IVec3(0);
	}

	bool done = false;

	IVec3 gridCoord[2] = {gridCoordMin[0], gridCoordMin[1]};

    while (!done)
	{
		if (verifySampleTexelGridCoords(args, result, gridCoord[0], gridCoord[1], lodBounds, level, mipmapFilter, report))
			return true;

		// Get next grid coordinate to test at

		// Represents whether the increment at a position wraps and should "carry" to the next place
		bool carry = true;

		for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
		{
			for (int compNdx = 0; compNdx < 3; ++compNdx)
			{
				if (carry)
				{
					deInt32& comp = gridCoord[levelNdx][compNdx];
				    ++comp;

					if (comp > gridCoordMax[levelNdx][compNdx])
					{
						comp = gridCoordMin[levelNdx][compNdx];
					}
					else
					{
						carry = false;
					}
				}
			}
		}

		done = carry;
	}

	return false;
}